

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

void Gia_MuxStructDump_rec(Gia_Man_t *p,int iObj,int fFirst,Vec_Str_t *vStr,int nDigitsId)

{
  uint uVar1;
  uint *puVar2;
  Gia_Obj_t *pGVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  
  if ((iObj < 0) || (p->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar7 = p->pObjs + (uint)iObj;
  puVar2 = p->pMuxes;
  if (fFirst == 0) {
    if (puVar2 == (uint *)0x0) {
      return;
    }
    if (puVar2[(uint)iObj] == 0) {
      return;
    }
    if (0 < p->pRefs[(uint)iObj]) {
      return;
    }
LAB_0021fadb:
    uVar8 = puVar2[(uint)iObj];
    if (uVar8 == 0) goto LAB_0021fb23;
    if ((int)uVar8 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar8 = uVar8 >> 1;
  }
  else {
    if (puVar2 != (uint *)0x0) goto LAB_0021fadb;
LAB_0021fb23:
    uVar8 = 0xffffffff;
  }
  uVar1 = vStr->nSize;
  if (uVar1 == vStr->nCap) {
    if ((int)uVar1 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar5;
      vStr->nCap = 0x10;
    }
    else {
      sVar4 = (ulong)uVar1 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar4);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,sVar4);
      }
      vStr->pArray = pcVar5;
      vStr->nCap = (int)sVar4;
    }
  }
  else {
    pcVar5 = vStr->pArray;
  }
  iVar6 = vStr->nSize;
  vStr->nSize = iVar6 + 1;
  pcVar5[iVar6] = '[';
  uVar1 = vStr->nSize;
  if (uVar1 == vStr->nCap) {
    if ((int)uVar1 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar5;
      vStr->nCap = 0x10;
    }
    else {
      sVar4 = (ulong)uVar1 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar4);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,sVar4);
      }
      vStr->pArray = pcVar5;
      vStr->nCap = (int)sVar4;
    }
  }
  else {
    pcVar5 = vStr->pArray;
  }
  iVar6 = vStr->nSize;
  vStr->nSize = iVar6 + 1;
  pcVar5[iVar6] = '(';
  if (((p->pMuxes == (uint *)0x0) || (p->pMuxes[(int)uVar8] == 0)) || (p->pRefs[(int)uVar8] != 0)) {
    Vec_StrPrintNumStar(vStr,uVar8,nDigitsId);
  }
  else {
    Gia_MuxStructDump_rec(p,uVar8,0,vStr,nDigitsId);
  }
  uVar8 = vStr->nSize;
  if (uVar8 == vStr->nCap) {
    if ((int)uVar8 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar5;
      vStr->nCap = 0x10;
    }
    else {
      sVar4 = (ulong)uVar8 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar4);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,sVar4);
      }
      vStr->pArray = pcVar5;
      vStr->nCap = (int)sVar4;
    }
  }
  else {
    pcVar5 = vStr->pArray;
  }
  iVar6 = vStr->nSize;
  vStr->nSize = iVar6 + 1;
  pcVar5[iVar6] = ')';
  pGVar3 = p->pObjs;
  if (p->pMuxes != (uint *)0x0) {
    if ((pGVar7 < pGVar3) || (pGVar3 + p->nObjs <= pGVar7)) goto LAB_0021ff95;
    iVar6 = (int)((long)pGVar7 - (long)pGVar3 >> 2) * -0x55555555;
    uVar8 = p->pMuxes[iVar6];
    if ((int)uVar8 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    if ((uVar8 & 1) != 0) {
      Gia_MuxStructDump_rec(p,iVar6 - (*(uint *)pGVar7 & 0x1fffffff),0,vStr,nDigitsId);
      uVar8 = vStr->nSize;
      if (uVar8 == vStr->nCap) {
        if ((int)uVar8 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar5;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar8 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar4);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar5;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar5 = vStr->pArray;
      }
      iVar6 = vStr->nSize;
      vStr->nSize = iVar6 + 1;
      pcVar5[iVar6] = '|';
      pGVar3 = p->pObjs;
      if ((pGVar7 < pGVar3) || (pGVar3 + p->nObjs <= pGVar7)) goto LAB_0021ff95;
      iVar6 = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2);
      uVar8 = *(uint *)&pGVar7->field_0x4;
      goto LAB_0021ff01;
    }
  }
  if ((pGVar3 <= pGVar7) && (pGVar7 < pGVar3 + p->nObjs)) {
    Gia_MuxStructDump_rec
              (p,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555 -
                 (*(uint *)&pGVar7->field_0x4 & 0x1fffffff),0,vStr,nDigitsId);
    uVar8 = vStr->nSize;
    if (uVar8 == vStr->nCap) {
      if ((int)uVar8 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(0x10);
        }
        else {
          pcVar5 = (char *)realloc(vStr->pArray,0x10);
        }
        vStr->pArray = pcVar5;
        vStr->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar8 * 2;
        if (vStr->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(sVar4);
        }
        else {
          pcVar5 = (char *)realloc(vStr->pArray,sVar4);
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar4;
      }
    }
    else {
      pcVar5 = vStr->pArray;
    }
    iVar6 = vStr->nSize;
    vStr->nSize = iVar6 + 1;
    pcVar5[iVar6] = '|';
    pGVar3 = p->pObjs;
    if ((pGVar3 <= pGVar7) && (pGVar7 < pGVar3 + p->nObjs)) {
      iVar6 = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2);
      uVar8 = *(uint *)pGVar7;
LAB_0021ff01:
      Gia_MuxStructDump_rec(p,iVar6 * -0x55555555 - (uVar8 & 0x1fffffff),0,vStr,nDigitsId);
      uVar8 = vStr->nSize;
      if (uVar8 == vStr->nCap) {
        if ((int)uVar8 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar5;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar8 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar4);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar5;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar5 = vStr->pArray;
      }
      iVar6 = vStr->nSize;
      vStr->nSize = iVar6 + 1;
      pcVar5[iVar6] = ']';
      return;
    }
  }
LAB_0021ff95:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_MuxStructDump_rec( Gia_Man_t * p, int iObj, int fFirst, Vec_Str_t * vStr, int nDigitsId )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    int iCtrl;
    if ( !fFirst && (!Gia_ObjIsMuxId(p, iObj) || Gia_ObjRefNumId(p, iObj) > 0) )
        return;
    iCtrl = Gia_ObjFaninId2p(p, pObj);
    Vec_StrPush( vStr, '[' );
    Vec_StrPush( vStr, '(' );
    if ( Gia_ObjIsMuxId(p, iCtrl) && Gia_ObjRefNumId(p, iCtrl) == 0 )
        Gia_MuxStructDump_rec( p, iCtrl, 0, vStr, nDigitsId );
    else
        Vec_StrPrintNumStar( vStr, iCtrl, nDigitsId );
    Vec_StrPush( vStr, ')' );
    if ( Gia_ObjFaninC2(p, pObj) )
    {
        Gia_MuxStructDump_rec( p, Gia_ObjFaninId0p(p, pObj), 0, vStr, nDigitsId );
        Vec_StrPush( vStr, '|' );
        Gia_MuxStructDump_rec( p, Gia_ObjFaninId1p(p, pObj), 0, vStr, nDigitsId );
        Vec_StrPush( vStr, ']' );
    }
    else
    {
        Gia_MuxStructDump_rec( p, Gia_ObjFaninId1p(p, pObj), 0, vStr, nDigitsId );
        Vec_StrPush( vStr, '|' );
        Gia_MuxStructDump_rec( p, Gia_ObjFaninId0p(p, pObj), 0, vStr, nDigitsId );
        Vec_StrPush( vStr, ']' );
    }
}